

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snprintf_support.c
# Opt level: O3

uint parse_format(char *format,char *pformatList,uint maxFormats)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  
  if (maxFormats == 0) {
    uVar9 = 0;
  }
  else {
    uVar6 = 0;
    uVar10 = 0;
    do {
      while( true ) {
        uVar9 = (uint)uVar10;
        uVar11 = (uint)uVar6;
        if (format[uVar6] != '%') {
          if (format[uVar6] == '\0') {
            return uVar9;
          }
          goto LAB_00110e90;
        }
        uVar5 = (ulong)(byte)format[uVar6 + 1];
        uVar4 = uVar6 + 1;
        uVar7 = (uint)uVar4;
        if (uVar5 < 0x31) break;
LAB_00110d47:
        uVar7 = (uint)uVar4;
        do {
          uVar7 = uVar7 + 1;
          uVar3 = (uint)uVar4;
          bVar2 = format[uVar4 & 0xffffffff];
          uVar4 = (ulong)(uVar3 + 1);
        } while ((byte)(bVar2 - 0x30) < 10);
        if (bVar2 == 0x2e) {
          do {
            uVar3 = uVar7;
            bVar2 = format[uVar3];
            uVar7 = uVar3 + 1;
          } while ((byte)(bVar2 - 0x30) < 10);
        }
        if (bVar2 < 0x6c) {
          if (bVar2 != 0x4c) {
            if (bVar2 != 0x68) {
              if (bVar2 == 0x6a) goto LAB_00110dad;
              goto LAB_00110db1;
            }
            uVar4 = (ulong)(uVar3 + 1);
            if (format[uVar4] == 'h') {
              uVar3 = uVar3 + 2;
              bVar14 = true;
              bVar13 = false;
              goto LAB_00110e09;
            }
            bVar2 = 1;
            bVar14 = false;
            bVar13 = false;
            goto LAB_00110e0b;
          }
          bVar8 = 1;
          bVar14 = false;
          uVar4 = (ulong)uVar3;
          bVar13 = false;
          bVar2 = 0;
        }
        else {
          if (bVar2 == 0x6c) {
            uVar7 = uVar3 + 1;
            bVar13 = format[uVar7] != 'l';
            uVar3 = uVar3 + 2;
            if (bVar13) {
              uVar3 = uVar7;
            }
            bVar14 = false;
          }
          else {
            if ((bVar2 == 0x74) || (bVar2 == 0x7a)) {
LAB_00110dad:
              uVar3 = uVar3 + 1;
            }
LAB_00110db1:
            bVar14 = false;
            bVar13 = false;
          }
LAB_00110e09:
          uVar4 = (ulong)uVar3;
          bVar2 = 0;
LAB_00110e0b:
          bVar8 = 0;
        }
        uVar7 = (uint)uVar4;
        bVar1 = format[uVar4];
        switch(bVar1) {
        case 0x58:
        case 100:
        case 0x69:
        case 0x6f:
        case 0x75:
        case 0x78:
          bVar2 = bVar2 * '\x04' + 100;
          if (bVar13 != false) {
            bVar2 = 0x6c;
          }
          bVar14 = !bVar14;
          bVar8 = 99;
          goto LAB_00110e60;
        case 0x59:
        case 0x5a:
        case 0x5b:
        case 0x5c:
        case 0x5d:
        case 0x5e:
        case 0x5f:
        case 0x60:
        case 0x62:
        case 0x68:
        case 0x6a:
        case 0x6b:
        case 0x6c:
        case 0x71:
        case 0x72:
        case 0x74:
        case 0x76:
        case 0x77:
          goto switchD_00110e2d_caseD_59;
        case 0x61:
        case 0x65:
        case 0x66:
        case 0x67:
switchD_00110e2d_caseD_61:
          pformatList[uVar10] = (bVar8 ^ 1) << 5 | 0x47;
          break;
        case 99:
          pformatList[uVar10] = (bVar13 ^ 1U) << 5 | 0x43;
          break;
        case 0x6d:
          uVar7 = uVar7 + 1;
          goto LAB_00110e33;
        case 0x6e:
          bVar2 = bVar2 ^ 0x33;
          if (bVar13 != false) {
            bVar2 = 0x34;
          }
          bVar14 = !bVar14;
          bVar8 = 0x31;
          goto LAB_00110e60;
        case 0x70:
          pformatList[uVar10] = 'p';
          break;
        case 0x73:
          bVar2 = (bVar8 ^ 1) << 5 | 0x53;
          bVar14 = bVar13 == false;
          bVar8 = 0x53;
LAB_00110e60:
          if (!bVar14) {
            bVar2 = bVar8;
          }
          pformatList[uVar10] = bVar2;
          break;
        default:
          if ((bVar1 - 0x45 < 3) || (bVar1 == 0x41)) goto switchD_00110e2d_caseD_61;
          goto switchD_00110e2d_caseD_59;
        }
        uVar10 = (ulong)(uVar9 + 1);
        uVar6 = (ulong)(uVar7 + 1);
LAB_00110e90:
        uVar9 = (uint)uVar10;
        uVar11 = (uint)(format[uVar6] != '%') + (int)uVar6;
        uVar6 = (ulong)uVar11;
        if (0xfff < uVar11) {
          return uVar9;
        }
        if (maxFormats <= uVar9) {
          return uVar9;
        }
      }
      if ((0x1280900000000U >> (uVar5 & 0x3f) & 1) != 0) {
        uVar4 = (ulong)(uVar11 + 2);
        goto LAB_00110d47;
      }
      if ((0x2000000001U >> (uVar5 & 0x3f) & 1) == 0) goto LAB_00110d47;
LAB_00110e33:
      uVar6 = (ulong)uVar7;
    } while (uVar7 < 0x1000);
  }
  return uVar9;
switchD_00110e2d_caseD_59:
  __printf_chk(1,"failed to recognize format string [");
  if (uVar11 < uVar7) {
    lVar12 = 0;
    do {
      __printf_chk(1,"%c",(int)format[lVar12 + uVar6]);
      lVar12 = lVar12 + 1;
    } while (uVar7 - uVar11 != (int)lVar12);
  }
  puts("]");
  uVar6 = uVar4;
  goto LAB_00110e90;
}

Assistant:

unsigned int
parse_format(const char *format, char pformatList[], unsigned int maxFormats)
{
	unsigned int  numFormats = 0;
	unsigned int  index = 0;
	unsigned int  start = 0;
	char		  lmod = 0;

	while (index < RSIZE_MAX_STR && format[index] != '\0' && numFormats < maxFormats)
	{
		if (format[index] == '%') {
			start = index; // remember where the format string started
			// Check for flags
			switch( format[++index]) {
			case '\0': continue; // skip - end of format string
			case '%' : continue; // skip - actually a percent character
			case '#' : // convert to alternate form
			case '0' : // zero pad
			case '-' : // left adjust
			case ' ' : // pad with spaces
			case '+' : // force a sign be used
				index++; // skip the flag character
				break;
			}
			// check for and skip the optional field width
			while ( format[index] != '\0' && format[index] >= '0' && format[index] <= '9') {
				index++;
			}
			// Check for an skip the optional precision
			if ( format[index] != '\0' && format[index] == '.') {
				index++; // skip the period
				while ( format[index] != '\0' && format[index] >= '0' && format[index] <= '9') {
					index++;
				}
			}
			// Check for and skip the optional length modifiers
			lmod = ' ';
			switch( format[index]) {
			case 'h' : if ( format[++index] == 'h') {
				           ++index; //also recognize the 'hh' modifier
				           lmod = 'H'; // for char
			           } else {
			               lmod = 'h'; // for short
			           }
					   break;
			case 'l' : if ( format[++index] == 'l') {
				           ++index; //also recognize the 'll' modifier
				           lmod = 'd'; // for long long
			           } else {
			               lmod = 'l'; // for long
			           }
			           break;
			case 'L' : lmod = 'L'; break;
			case 'j' :
			case 'z' :
			case 't' : index++;
			           break;
			}

			// Recognize and record the actual modifier
			switch( format[index]) {
			case 'c' :
				 if ( lmod == 'l') {
					 pformatList[numFormats] = FMT_WCHAR; // store the format character
				 } else {
					 pformatList[numFormats] = FMT_CHAR;
				 }
				 numFormats++;
				 index++; // skip the format character
				 break;

			case 'd' : case 'i' : // signed
			case 'o' : case 'u' : // unsigned
			case 'x' : case 'X' : // unsigned
				 if ( lmod == 'H') {
					 pformatList[numFormats] = FMT_CHAR; // store the format character
				 } else if ( lmod == 'l') {
				 	 pformatList[numFormats] = FMT_LONG; // store the format character
				 } else if ( lmod == 'h') {
					 pformatList[numFormats] = FMT_SHORT; // store the format character
				 } else{
					 pformatList[numFormats] = FMT_INT;
				 }
				 numFormats++;
				 index++; // skip the format character
				 break;

			case 'e' : case 'E' :
			case 'f' : case 'F' :
			case 'g' : case 'G' :
			case 'a' : case 'A' :
				 if ( lmod == 'L') {
					 pformatList[numFormats] = FMT_LDOUBLE; // store the format character
				 } else{
					 pformatList[numFormats] = FMT_DOUBLE;
				 }
				 numFormats++;
				 index++; // skip the format character
				 break;

			case 's' :
				 if ( lmod == 'l' || lmod == 'L') {
					 pformatList[numFormats] = FMT_WSTRING; // store the format character
				 } else {
					 pformatList[numFormats] = FMT_STRING;
				 }
				 numFormats++;
				 index++; // skip the format character
				 break;

			case 'p' :
				 pformatList[numFormats] = FMT_VOID;
				 numFormats++;
				 index++; // skip the format character
				 break;

			case 'n' :
				 if ( lmod == 'H') {
					 pformatList[numFormats] = FMT_PCHAR; // store the format character
				 } else if ( lmod == 'l') {
					 pformatList[numFormats] = FMT_PLONG; // store the format character
				 } else if ( lmod == 'h') {
					 pformatList[numFormats] = FMT_PSHORT; // store the format character
				 } else{
					 pformatList[numFormats] = FMT_PINT;
				 }
				 numFormats++;
				 index++; // skip the format character
				 break;
			case 'm' :
			     // Does not represent an argument in the call stack
			     index++; // skip the format character
			     continue;
			default:
				printf("failed to recognize format string [");
				for (;start<index; start++) { printf("%c", format[start]); }
				puts("]");
				break;
			}
		}
        if (format[index] != '%')
            // don't know why it skips over blindly, not handling cases such as "%s%d".
            index++; // move past this character
	}

	return numFormats;
}